

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casDec.c
# Opt level: O3

void WriteLUTSintoBLIFfile
               (FILE *pFile,DdManager *dd,LUT **pLuts,int nLuts,DdNode **bCVars,char **pNames,
               int nNames,char *FileName)

{
  LUT *pLVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  DdNode *n;
  DdNode *n_00;
  DdNode *n_01;
  long lVar5;
  char **ppcVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (0 < nLuts) {
    uVar8 = 0;
    do {
      pLVar1 = pLuts[uVar8];
      if ((uVar8 == nLuts - 1) && (pLVar1->nMulti != 1)) {
        __assert_fail("p->nMulti == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/cas/casDec.c"
                      ,0x1b1,
                      "void WriteLUTSintoBLIFfile(FILE *, DdManager *, LUT **, int, DdNode **, char **, int, char *)"
                     );
      }
      fprintf((FILE *)pFile,"#----------------- LUT #%d ----------------------\n",uVar8 & 0xffffffff
             );
      iVar2 = pLVar1->nInsP;
      if (0 < iVar2 && uVar8 != 0) {
        uVar7 = 0;
        do {
          sprintf(WriteLUTSintoBLIFfile::Buffer,"LUT%02d_%02d",(int)uVar8 + -1,uVar7 & 0xffffffff);
          pcVar3 = Extra_UtilStrsav(WriteLUTSintoBLIFfile::Buffer);
          WriteLUTSintoBLIFfile::pNamesLocalIn[dd->invperm[uVar7]] = pcVar3;
          uVar7 = uVar7 + 1;
          iVar2 = pLVar1->nInsP;
        } while ((long)uVar7 < (long)iVar2);
      }
      if (iVar2 < pLVar1->nIns) {
        uVar7 = (ulong)(uint)pLVar1->Level;
        lVar5 = 0;
        do {
          pcVar3 = Extra_UtilStrsav(pNames[dd->invperm[(int)uVar7 + lVar5]]);
          uVar7 = (ulong)pLVar1->Level;
          WriteLUTSintoBLIFfile::pNamesLocalIn[dd->invperm[uVar7 + lVar5]] = pcVar3;
          lVar5 = lVar5 + 1;
        } while ((int)lVar5 < pLVar1->nIns - pLVar1->nInsP);
      }
      if (0 < pLVar1->nMulti) {
        pcVar3 = WriteLUTSintoBLIFfile::Buffer;
        if (uVar8 == nLuts - 1) {
          pcVar3 = "F";
        }
        ppcVar6 = WriteLUTSintoBLIFfile::pNamesLocalOut;
        uVar7 = 0;
        do {
          sprintf(WriteLUTSintoBLIFfile::Buffer,"LUT%02d_%02d",uVar8,uVar7 & 0xffffffff);
          pcVar4 = Extra_UtilStrsav(pcVar3);
          *ppcVar6 = pcVar4;
          uVar7 = uVar7 + 1;
          ppcVar6 = ppcVar6 + 1;
        } while ((long)uVar7 < (long)pLVar1->nMulti);
      }
      sprintf(WriteLUTSintoBLIFfile::Buffer,"L%02d_",uVar8);
      n = Extra_bddBitsToCube(dd,~(-1 << ((byte)pLVar1->nMulti & 0x1f)),pLVar1->nMulti,bCVars,1);
      Cudd_Ref(n);
      if (0 < pLVar1->nMulti) {
        ppcVar6 = WriteLUTSintoBLIFfile::pNamesLocalOut;
        uVar7 = 0;
        do {
          n_00 = Cudd_Cofactor(dd,pLVar1->bRelation,bCVars[uVar7]);
          Cudd_Ref(n_00);
          n_01 = Cudd_bddExistAbstract(dd,n_00,n);
          Cudd_Ref(n_01);
          Cudd_RecursiveDeref(dd,n_00);
          sprintf(WriteLUTSintoBLIFfile::Buffer,"L%02d_%02d_",uVar8,uVar7 & 0xffffffff);
          WriteDDintoBLIFfile(pFile,n_01,*ppcVar6,WriteLUTSintoBLIFfile::Buffer,
                              WriteLUTSintoBLIFfile::pNamesLocalIn);
          Cudd_RecursiveDeref(dd,n_01);
          uVar7 = uVar7 + 1;
          ppcVar6 = ppcVar6 + 1;
        } while ((long)uVar7 < (long)pLVar1->nMulti);
      }
      Cudd_RecursiveDeref(dd,n);
      iVar2 = dd->size;
      if (0 < iVar2) {
        ppcVar6 = WriteLUTSintoBLIFfile::pNamesLocalIn;
        lVar5 = 0;
        do {
          if (*ppcVar6 != (char *)0x0) {
            free(*ppcVar6);
            iVar2 = dd->size;
          }
          *ppcVar6 = (char *)0x0;
          lVar5 = lVar5 + 1;
          ppcVar6 = ppcVar6 + 1;
        } while (lVar5 < iVar2);
      }
      iVar2 = pLVar1->nMulti;
      if (0 < iVar2) {
        ppcVar6 = WriteLUTSintoBLIFfile::pNamesLocalOut;
        lVar5 = 0;
        do {
          if (*ppcVar6 != (char *)0x0) {
            free(*ppcVar6);
            *ppcVar6 = (char *)0x0;
            iVar2 = pLVar1->nMulti;
          }
          lVar5 = lVar5 + 1;
          ppcVar6 = ppcVar6 + 1;
        } while (lVar5 < iVar2);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)nLuts);
  }
  return;
}

Assistant:

void WriteLUTSintoBLIFfile( FILE * pFile, DdManager * dd, LUT ** pLuts, int nLuts, DdNode ** bCVars, char ** pNames, int nNames, char * FileName )
{
    int i, v, o;
    static char * pNamesLocalIn[MAXINPUTS];
    static char * pNamesLocalOut[MAXINPUTS];
    static char Buffer[100];
    DdNode * bCube, * bCof, * bFunc;
    LUT * p;

    // go through all the LUTs
    for ( i = 0; i < nLuts; i++ )
    {
        // get the pointer to the LUT
        p = pLuts[i];

        if ( i == nLuts -1 )
        {
            assert( p->nMulti == 1 );
        }


        fprintf( pFile, "#----------------- LUT #%d ----------------------\n", i );


        // fill in the names for the current LUT

        // write the outputs of the previous LUT
        if ( i != 0 )
        for ( v = 0; v < p->nInsP; v++ )
        {
            sprintf( Buffer, "LUT%02d_%02d", i-1, v );
            pNamesLocalIn[dd->invperm[v]] = Extra_UtilStrsav( Buffer );
        }
        // write the primary inputs of the current LUT
        for ( v = 0; v < p->nIns - p->nInsP; v++ )
            pNamesLocalIn[dd->invperm[p->Level+v]] = Extra_UtilStrsav( pNames[dd->invperm[p->Level+v]] );
        // write the outputs of the current LUT
        for ( v = 0; v < p->nMulti; v++ )
        {
            sprintf( Buffer, "LUT%02d_%02d", i, v );
            if ( i != nLuts - 1 )
                pNamesLocalOut[v] = Extra_UtilStrsav( Buffer );
            else 
                pNamesLocalOut[v] = Extra_UtilStrsav( "F" );
        }


        // write LUT outputs

        // get the prefix
        sprintf( Buffer, "L%02d_", i );

        // get the cube of encoding variables
        bCube = Extra_bddBitsToCube( dd, (1<<p->nMulti)-1, p->nMulti, bCVars, 1 );   Cudd_Ref( bCube );

        // write each output of the LUT
        for ( o = 0; o < p->nMulti; o++ )
        {
            // get the cofactor of this output
            bCof = Cudd_Cofactor( dd, p->bRelation, bCVars[o] );  Cudd_Ref( bCof );
            // quantify the remaining variables to get the function
            bFunc = Cudd_bddExistAbstract( dd, bCof, bCube );     Cudd_Ref( bFunc );
            Cudd_RecursiveDeref( dd, bCof );
            
            // write BLIF
            sprintf( Buffer, "L%02d_%02d_", i, o );

//          WriteDDintoBLIFfileReorder( dd, pFile, bFunc, pNamesLocalOut[o], Buffer, pNamesLocalIn );
            // does not work well; the advantage is marginal (30%), the run time is huge...

            WriteDDintoBLIFfile( pFile, bFunc, pNamesLocalOut[o], Buffer, pNamesLocalIn );
            Cudd_RecursiveDeref( dd, bFunc );
        }
        Cudd_RecursiveDeref( dd, bCube );

        // clean up the previous local names
        for ( v = 0; v < dd->size; v++ )
        {
            if ( pNamesLocalIn[v] )
                ABC_FREE( pNamesLocalIn[v] );
            pNamesLocalIn[v] = NULL;
        }
        for ( v = 0; v < p->nMulti; v++ )
            ABC_FREE( pNamesLocalOut[v] );
    }
}